

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Vec_Int_t * Gia_ManSortCoBySuppSize(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  word *pData;
  Vec_Int_t *pVVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int nSize;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  p_00 = Vec_IntAlloc(p->vCos->nSize);
  uVar1 = p->vCos->nSize;
  uVar6 = (ulong)uVar1;
  if (uVar1 - 1 < 0xf) {
    uVar6 = 0x10;
  }
  if ((int)uVar6 == 0) {
    pData = (word *)0x0;
  }
  else {
    pData = (word *)malloc((long)(int)uVar6 << 3);
  }
  uVar8 = 0;
  lVar7 = 0;
  do {
    nSize = (int)lVar7;
    if (vSupps->nSize <= lVar7) {
      Abc_QuickSort3(pData,nSize,1);
      for (lVar4 = 0; lVar7 != lVar4; lVar4 = lVar4 + 1) {
        Vec_IntPush(p_00,*(int *)((long)pData + lVar4 * 8 + 4));
      }
      free(pData);
      return p_00;
    }
    pVVar3 = Vec_WecEntry(vSupps,nSize);
    iVar2 = pVVar3->nSize;
    iVar5 = (int)uVar6;
    if (nSize == iVar5) {
      uVar9 = (ulong)(uint)(iVar5 * 2);
      if (iVar5 < 0x10) {
        uVar9 = 0x10;
      }
      if (iVar5 < (int)uVar9) {
        if (pData == (word *)0x0) {
          pData = (word *)malloc(uVar9 << 3);
        }
        else {
          pData = (word *)realloc(pData,uVar9 << 3);
        }
        uVar6 = uVar9;
        if (pData == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
      }
    }
    pData[lVar7] = (long)iVar2 | uVar8;
    lVar7 = lVar7 + 1;
    uVar8 = uVar8 + 0x100000000;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManSortCoBySuppSize( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Vec_Int_t * vOrder = Vec_IntAlloc( Gia_ManCoNum(p) );
    Vec_Wrd_t * vSortData = Vec_WrdAlloc( Gia_ManCoNum(p) );
    Vec_Int_t * vSuppOne; word Entry; int i;
    Vec_WecForEachLevel( vSupps, vSuppOne, i )
        Vec_WrdPush( vSortData, ((word)i << 32) | Vec_IntSize(vSuppOne) );
    Abc_QuickSort3( Vec_WrdArray(vSortData), Vec_WrdSize(vSortData), 1 );
    Vec_WrdForEachEntry( vSortData, Entry, i )
        Vec_IntPush( vOrder, (int)(Entry >> 32) );
    Vec_WrdFree( vSortData );
    return vOrder;
}